

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferActiveUniformValidation.cpp
# Opt level: O3

char * __thiscall
glcts::TextureBufferActiveUniformValidationVSFS::getVertexShaderCode
          (TextureBufferActiveUniformValidationVSFS *this)

{
  return 
  "${VERSION}\n\nprecision highp float;\n\nvoid main(void)\n{\n    gl_Position = vec4(0.0, 0.0, 0.0, 0.0);\n}\n"
  ;
}

Assistant:

const char* TextureBufferActiveUniformValidationVSFS::getVertexShaderCode() const
{
	const char* result = "${VERSION}\n"
						 "\n"
						 "precision highp float;\n"
						 "\n"
						 "void main(void)\n"
						 "{\n"
						 "    gl_Position = vec4(0.0, 0.0, 0.0, 0.0);\n"
						 "}\n";

	return result;
}